

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createVarArg(LLVMPointerGraphBuilder *this,IntrinsicInst *Inst)

{
  function_ref<void_(const_llvm::Value_*)> Func;
  BasicBlock *this_00;
  mapped_type *ppPVar1;
  PSNodesSeq *this_01;
  Instruction *in_RDX;
  LLVMPointerGraphBuilder *in_RSI;
  PSNode *in_RDI;
  PSNode *S2;
  PSNode *S1;
  PSNode *ptr;
  PSNode *op;
  PSNode *vastart;
  PSNode *arg;
  PointerSubgraph *subg;
  Function *F;
  PSNodesSeq *ret;
  PSNodesSeq *in_stack_ffffffffffffff70;
  PSNode *this_02;
  anon_class_1_0_00000001 local_59;
  function_ref<void(llvm::Value_const*)> local_58 [16];
  PSNode *local_48;
  PSNode *local_40;
  PSNode *local_38;
  mapped_type local_30;
  Function *local_28;
  undefined1 local_19;
  Instruction *local_18;
  
  local_19 = 0;
  this_02 = in_RDI;
  local_18 = in_RDX;
  PSNodesSeq::PSNodesSeq(in_stack_ffffffffffffff70);
  this_00 = llvm::Instruction::getParent(local_18);
  local_28 = llvm::BasicBlock::getParent(this_00);
  ppPVar1 = std::
            unordered_map<const_llvm::Function_*,_dg::pta::PointerSubgraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>_>
            ::operator[]((unordered_map<const_llvm::Function_*,_dg::pta::PointerSubgraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::pta::PointerSubgraph_*>_>_>
                          *)in_stack_ffffffffffffff70,(key_type *)in_RDI);
  local_30 = *ppPVar1;
  local_38 = local_30->vararg;
  local_40 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)in_stack_ffffffffffffff70)
  ;
  this_01 = (PSNodesSeq *)
            llvm::CallBase::getOperand
                      ((CallBase *)in_stack_ffffffffffffff70,(uint)((ulong)in_RDI >> 0x20));
  llvm::function_ref<void(llvm::Value_const*)>::
  function_ref<llvm::Value::stripInBoundsOffsets(llvm::function_ref<void(llvm::Value_const*)>)::_default_arg_1_::_lambda(llvm::Value_const*)_1_>
            (local_58,&local_59,
             (enable_if_t<_std::is_same<remove_cvref_t<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>,_function_ref<void_(const_Value_*)>_>::value>
              *)0x0,(enable_if_t<std::is_void<void>::value____std::is_convertible<decltype(std::declval<(lambda_at__usr_lib_llvm_14_include_llvm_IR_Value_h:745:35)>()(std::declval<const_Value_*>())),_void>::value>
                     *)0x0);
  Func.callable = (intptr_t)this_02;
  Func.callback = (_func_void_intptr_t_Value_ptr *)in_RSI;
  llvm::Value::stripInBoundsOffsets((Value *)this_01,Func);
  local_48 = getOperand(in_RSI,(Value *)this_01);
  PointerGraph::create<(dg::pta::PSNodeType)4,dg::pta::PSNode*&,unsigned_long_const&>
            ((PointerGraph *)this_02,(PSNode **)in_RSI,(unsigned_long *)this_01);
  PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
            ((PointerGraph *)this_02,(PSNode **)in_RSI,(PSNode **)this_01);
  PointerGraph::create<(dg::pta::PSNodeType)3,dg::pta::PSNode*&,dg::pta::PSNode*&>
            ((PointerGraph *)this_02,(PSNode **)in_RSI,(PSNode **)this_01);
  PSNodesSeq::append(this_01,in_RDI);
  PSNodesSeq::append(this_01,in_RDI);
  PSNodesSeq::append(this_01,in_RDI);
  PSNodesSeq::append(this_01,in_RDI);
  PSNodesSeq::setRepresentant((PSNodesSeq *)this_02,local_40);
  return (PSNodesSeq *)in_RDI;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createVarArg(const llvm::IntrinsicInst *Inst) {
    // just store all the pointers from vararg argument
    // to the memory given in vastart() on Offset::UNKNOWN.
    // It is the easiest thing we can do without any further
    // analysis
    PSNodesSeq ret;

    // first we need to get the vararg argument phi
    const llvm::Function *F = Inst->getParent()->getParent();
    PointerSubgraph *subg = subgraphs_map[F];
    assert(subg);
    PSNode *arg = subg->vararg;
    assert(F->isVarArg() && "vastart in a non-variadic function");
    assert(arg && "Don't have variadic argument in a variadic function");

    // vastart will be node that will keep the memory
    // with pointers, its argument is the alloca, that
    // alloca will keep pointer to vastart
    PSNode *vastart = PS.create<PSNodeType::ALLOC>();

    // vastart has only one operand which is the struct
    // it uses for storing the va arguments. Strip it so that we'll
    // get the underlying alloca inst
    PSNode *op = getOperand(Inst->getOperand(0)->stripInBoundsOffsets());
    // the argument is usually an alloca, but it may be a load
    // in the case the code was transformed by -reg2mem
    assert((op->getType() == PSNodeType::ALLOC ||
            op->getType() == PSNodeType::LOAD) &&
           "Argument of vastart is invalid");
    // get node with the same pointer, but with Offset::UNKNOWN
    // FIXME: we're leaking it
    // make the memory in alloca point to our memory in vastart
    PSNode *ptr = PS.create<PSNodeType::GEP>(op, Offset::UNKNOWN);
    PSNode *S1 = PS.create<PSNodeType::STORE>(vastart, ptr);
    // and also make vastart point to the vararg args
    PSNode *S2 = PS.create<PSNodeType::STORE>(arg, vastart);

    ret.append(vastart);
    ret.append(ptr);
    ret.append(S1);
    ret.append(S2);

    ret.setRepresentant(vastart);

    return ret;
}